

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Visualizer.cpp
# Opt level: O1

bool __thiscall iDynTree::Visualizer::drawToFile(Visualizer *this,string *filename)

{
  if (this->pimpl->m_isInitialized == false) {
    iDynTree::reportError
              ("Visualizer","drawToFile",
               "Impossible to call drawToFile in a not initialized visualizer");
  }
  return false;
}

Assistant:

bool Visualizer::drawToFile(const std::string filename)
{
    bool retValue = false;

    if( !pimpl->m_isInitialized )
    {
        reportError("Visualizer","drawToFile","Impossible to call drawToFile in a not initialized visualizer");
        return false;
    }

#ifdef IDYNTREE_USES_IRRLICHT
    // Method based on http://www.irrlicht3d.org/wiki/index.php?n=Main.TakingAScreenShot
    irr::video::IImage* const image = pimpl->m_irrDriver->createScreenShot();
    if (image) //should always be true, but you never know
    {
        //write screenshot to file
        if (!pimpl->m_irrDriver->writeImageToFile(image, filename.c_str()))
        {
            std::stringstream ss;
            ss << "Impossible to write image file to " << filename;
            reportError("Visualizer","drawToFile",ss.str().c_str());
            retValue = false;
        }
        else
        {
            retValue = true;
        }

        //Don't forget to drop image since we don't need it anymore.
        image->drop();
    }
    else
    {
        reportError("Visualizer","drawToFile","Error in calling irr::video::IVideoDriver::createScreenShot method");
        return false;
    }
#else
    IDYNTREE_UNUSED(filename);
#endif

    return retValue;
}